

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

TabPosition __thiscall QMainWindowLayout::tabPosition(QMainWindowLayout *this,DockWidgetArea area)

{
  bool bVar1;
  long lVar2;
  TabPosition TVar3;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  lVar2 = 0;
  switch(area) {
  case LeftDockWidgetArea:
    break;
  case RightDockWidgetArea:
    lVar2 = 1;
    break;
  default:
    lVar2 = 4;
    bVar1 = false;
    break;
  case TopDockWidgetArea:
    lVar2 = 2;
    break;
  case BottomDockWidgetArea:
    lVar2 = 3;
  }
  if (bVar1) {
    TVar3 = *(TabPosition *)(this + lVar2 * 4 + 0x764);
  }
  else {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_18 = "default";
    TVar3 = North;
    QMessageLogger::warning
              (local_30,"QMainWindowLayout::tabPosition called with out-of-bounds value \'%d\'");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return TVar3;
  }
  __stack_chk_fail();
}

Assistant:

QTabWidget::TabPosition QMainWindowLayout::tabPosition(Qt::DockWidgetArea area) const
{
    const QInternal::DockPosition dockPos = toDockPos(area);
    if (dockPos < QInternal::DockCount)
        return tabPositions[dockPos];
    qWarning("QMainWindowLayout::tabPosition called with out-of-bounds value '%d'", int(area));
    return QTabWidget::North;
}